

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
::Resize(BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
         *this)

{
  uint size;
  uint bucketCount;
  uint uVar1;
  EntryType *dst;
  long lVar2;
  int i;
  long lVar3;
  AutoDoResize local_50;
  AutoDoResize autoDoResize;
  int *newBuckets;
  Type pSStack_38;
  int modIndex;
  
  local_50.lock = &this->super_AsymetricResizeLock;
  CCLock::Enter((CCLock *)this);
  size = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  bucketCount = DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetBucketSize
                          (size,(int *)((long)&newBuckets + 4));
  autoDoResize.lock = (AsymetricResizeLock *)0x0;
  pSStack_38 = (Type)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,size,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<void*,unsigned_long>,unsigned_long,Memory::HeapAllocator>
              (dst,(long)(int)size,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = size;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,(int **)&autoDoResize,&stack0xffffffffffffffc8,bucketCount,size);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<void*,unsigned_long>,unsigned_long,Memory::HeapAllocator>
              (pSStack_38,(long)(int)size,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    lVar2 = 8;
    for (lVar3 = 0; lVar3 < this->count; lVar3 = lVar3 + 1) {
      if (-2 < *(int *)((long)&(pSStack_38->
                               super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                               ).super_KeyValueEntry<void_*,_unsigned_long>.
                               super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                               .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.value + lVar2)
         ) {
        uVar1 = GetBucket((uint)(*(ulong *)((long)&(pSStack_38->
                                                                                                      
                                                  super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                                  ).super_KeyValueEntry<void_*,_unsigned_long>.
                                                  super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                                                  .
                                                  super_KeyValueEntryDataLayout2<void_*,_unsigned_long>
                                                  .next + lVar2) >> 3) | 1,bucketCount,
                          this->modFunctionIndex);
        *(undefined4 *)
         ((long)&(pSStack_38->
                 super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 ).super_KeyValueEntry<void_*,_unsigned_long>.
                 super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                 .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.value + lVar2) =
             *(undefined4 *)(((autoDoResize.lock)->cs).super_CCLock.mutexPtr + (long)(int)uVar1 * 4)
        ;
        *(int *)(((autoDoResize.lock)->cs).super_CCLock.mutexPtr + (long)(int)uVar1 * 4) =
             (int)lVar3;
      }
      lVar2 = lVar2 + 0x18;
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,size,size - this->size);
    }
    this->buckets = (Type)autoDoResize.lock;
    this->entries = pSStack_38;
    this->bucketCount = bucketCount;
    this->size = size;
  }
  AutoDoResize::~AutoDoResize(&local_50);
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }